

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O0

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5>::
set_display_type(ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *this,
                DisplayType display_type)

{
  pointer this_00;
  undefined1 local_28 [28];
  DisplayType display_type_local;
  ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)5> *this_local;
  
  local_28._20_4_ = display_type;
  unique0x10000068 =
       (tuple<Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>)
       (tuple<Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>)this;
  JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
  ::operator->((JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>
                *)local_28);
  this_00 = std::
            unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
            ::operator->((unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          *)local_28);
  ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>::set_display_type
            (this_00,local_28._20_4_);
  std::
  unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)local_28);
  return;
}

Assistant:

void set_display_type(Outputs::Display::DisplayType display_type) override {
			video_->set_display_type(display_type);
		}